

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O2

bool __thiscall
slang::ast::DiagnosticVisitor::tryApplyFromCache(DiagnosticVisitor *this,InstanceSymbol *symbol)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  group_type_pointer pgVar4;
  ulong uVar5;
  Compilation *pCVar6;
  InstanceSymbol *pIVar7;
  value_type_pointer ppVar8;
  InstanceSideEffects *pIVar9;
  pointer pIVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ushort uVar14;
  bool bVar15;
  byte bVar16;
  uint uVar17;
  InstanceSideEffects **ppIVar18;
  pointer ppVar19;
  ulong uVar20;
  ulong uVar21;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,slang::ast::DiagnosticVisitor::InstanceCacheEntry>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceCacheKey,void>,std::equal_to<slang::ast::InstanceCacheKey>,std::allocator<std::pair<slang::ast::InstanceCacheKey_const,slang::ast::DiagnosticVisitor::InstanceCacheEntry>>>
  *this_00;
  InstanceBodySymbol *args_2;
  ulong uVar22;
  ulong hash;
  IfacePortDriver *ifacePortDriver;
  InstanceCacheKey *other;
  long lVar23;
  ulong uVar24;
  pointer ifacePortDriver_00;
  uchar uVar25;
  uchar uVar27;
  uchar uVar28;
  byte bVar29;
  undefined1 auVar26 [16];
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  byte bVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  byte bVar38;
  uchar uVar39;
  uchar uVar40;
  uchar uVar41;
  byte bVar42;
  undefined1 auVar30 [16];
  bool valid;
  InstanceCacheKey key;
  try_emplace_args_t local_e2;
  bool local_e1;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  InstanceBodySymbol *local_b8;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,slang::ast::DiagnosticVisitor::InstanceCacheEntry>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceCacheKey,void>,std::equal_to<slang::ast::InstanceCacheKey>,std::allocator<std::pair<slang::ast::InstanceCacheKey_const,slang::ast::DiagnosticVisitor::InstanceCacheEntry>>>
  *local_b0;
  value_type_pointer local_a8;
  InstanceCacheKey local_a0;
  uchar local_78;
  uchar uStack_77;
  uchar uStack_76;
  byte bStack_75;
  uchar uStack_74;
  uchar uStack_73;
  uchar uStack_72;
  byte bStack_71;
  uchar uStack_70;
  uchar uStack_6f;
  uchar uStack_6e;
  byte bStack_6d;
  uchar uStack_6c;
  uchar uStack_6b;
  uchar uStack_6a;
  byte bStack_69;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  locator local_48;
  
  if ((this->disableCache != false) || (bVar15 = isEligibleForCaching(symbol), !bVar15)) {
    return false;
  }
  local_e1 = true;
  InstanceCacheKey::InstanceCacheKey(&local_a0,symbol,&local_e1);
  if (local_e1 == true) {
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_a0.savedHash;
    this_00 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,slang::ast::DiagnosticVisitor::InstanceCacheEntry>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceCacheKey,void>,std::equal_to<slang::ast::InstanceCacheKey>,std::allocator<std::pair<slang::ast::InstanceCacheKey_const,slang::ast::DiagnosticVisitor::InstanceCacheEntry>>>
               *)&this->instanceCache;
    args_2 = symbol->body;
    hash = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar13,8) ^
           SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar13,0);
    uVar20 = hash >> ((byte)(this->instanceCache).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_slang::hash<ast::InstanceCacheKey>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
                            .arrays.groups_size_index & 0x3f);
    lVar23 = (hash & 0xff) * 4;
    uVar25 = (&UNK_0040c7ac)[lVar23];
    uVar27 = (&UNK_0040c7ad)[lVar23];
    uVar28 = (&UNK_0040c7ae)[lVar23];
    bVar29 = (&UNK_0040c7af)[lVar23];
    uVar21 = (ulong)((uint)hash & 7);
    uVar22 = 0;
    uVar24 = uVar20;
    uVar31 = uVar25;
    uVar32 = uVar27;
    uVar33 = uVar28;
    bVar34 = bVar29;
    uVar35 = uVar25;
    uVar36 = uVar27;
    uVar37 = uVar28;
    bVar38 = bVar29;
    uVar39 = uVar25;
    uVar40 = uVar27;
    uVar41 = uVar28;
    bVar42 = bVar29;
    do {
      pgVar4 = (this->instanceCache).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_slang::hash<ast::InstanceCacheKey>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
               .arrays.groups_;
      pgVar2 = pgVar4 + uVar24;
      local_58 = pgVar2->m[0].n;
      uStack_57 = pgVar2->m[1].n;
      uStack_56 = pgVar2->m[2].n;
      bStack_55 = pgVar2->m[3].n;
      uStack_54 = pgVar2->m[4].n;
      uStack_53 = pgVar2->m[5].n;
      uStack_52 = pgVar2->m[6].n;
      bStack_51 = pgVar2->m[7].n;
      uStack_50 = pgVar2->m[8].n;
      uStack_4f = pgVar2->m[9].n;
      uStack_4e = pgVar2->m[10].n;
      bStack_4d = pgVar2->m[0xb].n;
      uStack_4c = pgVar2->m[0xc].n;
      uStack_4b = pgVar2->m[0xd].n;
      uStack_4a = pgVar2->m[0xe].n;
      bVar16 = pgVar2->m[0xf].n;
      auVar26[0] = -(local_58 == uVar25);
      auVar26[1] = -(uStack_57 == uVar27);
      auVar26[2] = -(uStack_56 == uVar28);
      auVar26[3] = -(bStack_55 == bVar29);
      auVar26[4] = -(uStack_54 == uVar31);
      auVar26[5] = -(uStack_53 == uVar32);
      auVar26[6] = -(uStack_52 == uVar33);
      auVar26[7] = -(bStack_51 == bVar34);
      auVar26[8] = -(uStack_50 == uVar35);
      auVar26[9] = -(uStack_4f == uVar36);
      auVar26[10] = -(uStack_4e == uVar37);
      auVar26[0xb] = -(bStack_4d == bVar38);
      auVar26[0xc] = -(uStack_4c == uVar39);
      auVar26[0xd] = -(uStack_4b == uVar40);
      auVar26[0xe] = -(uStack_4a == uVar41);
      auVar26[0xf] = -(bVar16 == bVar42);
      uVar17 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe);
      bStack_49 = bVar16;
      if (uVar17 != 0) {
        local_a8 = (this->instanceCache).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_slang::hash<ast::InstanceCacheKey>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
                   .arrays.elements_ + uVar24 * 0xf;
        local_d8 = uVar24;
        local_d0 = uVar22;
        local_c8 = uVar21;
        local_c0 = uVar20;
        local_b8 = args_2;
        local_b0 = this_00;
        local_78 = uVar25;
        uStack_77 = uVar27;
        uStack_76 = uVar28;
        bStack_75 = bVar29;
        uStack_74 = uVar31;
        uStack_73 = uVar32;
        uStack_72 = uVar33;
        bStack_71 = bVar34;
        uStack_70 = uVar35;
        uStack_6f = uVar36;
        uStack_6e = uVar37;
        bStack_6d = bVar38;
        uStack_6c = uVar39;
        uStack_6b = uVar40;
        uStack_6a = uVar41;
        bStack_69 = bVar42;
        do {
          local_e0 = (ulong)uVar17;
          iVar11 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> iVar11 & 1) == 0; iVar11 = iVar11 + 1) {
            }
          }
          other = (InstanceCacheKey *)
                  ((long)&(local_a8->first).symbol.ptr + (ulong)(uint)(iVar11 << 6));
          bVar15 = InstanceCacheKey::operator==(&local_a0,other);
          if (bVar15) {
            if (*(char *)&other[1].ifaceKeys.
                          super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish != '\0') goto LAB_00274813;
            pCVar6 = this->compilation;
            pIVar7 = other[1].symbol.ptr;
            auVar12._8_8_ = 0;
            auVar12._0_8_ = pIVar7;
            uVar21 = SUB168(auVar12 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                     SUB168(auVar12 * ZEXT816(0x9e3779b97f4a7c15),0);
            uVar20 = uVar21 >> ((byte)(pCVar6->instanceSideEffectMap).table_.
                                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
                                      .arrays.groups_size_index & 0x3f);
            uVar3 = (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      match_word(unsigned_long)::word)[uVar21 & 0xff];
            ppVar19 = (pointer)0x0;
            local_e0 = 0;
            goto LAB_0027476a;
          }
          uVar17 = (uint)local_e0 - 1 & (uint)local_e0;
        } while (uVar17 != 0);
        bVar16 = pgVar4[uVar24].m[0xf].n;
        uVar20 = local_c0;
        this_00 = local_b0;
        args_2 = local_b8;
        uVar21 = local_c8;
        uVar22 = local_d0;
        uVar24 = local_d8;
        uVar25 = local_78;
        uVar27 = uStack_77;
        uVar28 = uStack_76;
        bVar29 = bStack_75;
        uVar31 = uStack_74;
        uVar32 = uStack_73;
        uVar33 = uStack_72;
        bVar34 = bStack_71;
        uVar35 = uStack_70;
        uVar36 = uStack_6f;
        uVar37 = uStack_6e;
        bVar38 = bStack_6d;
        uVar39 = uStack_6c;
        uVar40 = uStack_6b;
        uVar41 = uStack_6a;
        bVar42 = bStack_69;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[uVar21] & bVar16) == 0) break;
      uVar5 = (this->instanceCache).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_slang::hash<ast::InstanceCacheKey>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
              .arrays.groups_size_mask;
      lVar23 = uVar24 + uVar22;
      uVar22 = uVar22 + 1;
      uVar24 = lVar23 + 1U & uVar5;
    } while (uVar22 <= uVar5);
    if ((this->instanceCache).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_slang::hash<ast::InstanceCacheKey>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
        .size_ctrl.size <
        (this->instanceCache).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_slang::hash<ast::InstanceCacheKey>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,slang::ast::DiagnosticVisitor::InstanceCacheEntry>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceCacheKey,void>,std::equal_to<slang::ast::InstanceCacheKey>,std::allocator<std::pair<slang::ast::InstanceCacheKey_const,slang::ast::DiagnosticVisitor::InstanceCacheEntry>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::InstanceCacheKey,slang::ast::InstanceBodySymbol_const&>
                (&local_48,this_00,uVar20,hash,&local_e2,&local_a0,args_2);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,slang::ast::DiagnosticVisitor::InstanceCacheEntry>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceCacheKey,void>,std::equal_to<slang::ast::InstanceCacheKey>,std::allocator<std::pair<slang::ast::InstanceCacheKey_const,slang::ast::DiagnosticVisitor::InstanceCacheEntry>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::InstanceCacheKey,slang::ast::InstanceBodySymbol_const&>
                (&local_48,this_00,hash,&local_e2,&local_a0,args_2);
    }
  }
  goto LAB_00274830;
  while( true ) {
    uVar22 = (pCVar6->instanceSideEffectMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
             .arrays.groups_size_mask;
    lVar23 = uVar20 + local_e0;
    local_e0 = local_e0 + 1;
    uVar20 = lVar23 + 1U & uVar22;
    if (uVar22 < local_e0) break;
LAB_0027476a:
    pgVar1 = (pCVar6->instanceSideEffectMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
             .arrays.groups_ + uVar20;
    local_68 = pgVar1->m[0].n;
    uStack_67 = pgVar1->m[1].n;
    uStack_66 = pgVar1->m[2].n;
    bStack_65 = pgVar1->m[3].n;
    uStack_64 = pgVar1->m[4].n;
    uStack_63 = pgVar1->m[5].n;
    uStack_62 = pgVar1->m[6].n;
    bStack_61 = pgVar1->m[7].n;
    uStack_60 = pgVar1->m[8].n;
    uStack_5f = pgVar1->m[9].n;
    uStack_5e = pgVar1->m[10].n;
    bStack_5d = pgVar1->m[0xb].n;
    uStack_5c = pgVar1->m[0xc].n;
    uStack_5b = pgVar1->m[0xd].n;
    uStack_5a = pgVar1->m[0xe].n;
    bStack_59 = pgVar1->m[0xf].n;
    uVar25 = (uchar)uVar3;
    auVar30[0] = -(local_68 == uVar25);
    uVar27 = (uchar)((uint)uVar3 >> 8);
    auVar30[1] = -(uStack_67 == uVar27);
    uVar28 = (uchar)((uint)uVar3 >> 0x10);
    auVar30[2] = -(uStack_66 == uVar28);
    bVar29 = (byte)((uint)uVar3 >> 0x18);
    auVar30[3] = -(bStack_65 == bVar29);
    auVar30[4] = -(uStack_64 == uVar25);
    auVar30[5] = -(uStack_63 == uVar27);
    auVar30[6] = -(uStack_62 == uVar28);
    auVar30[7] = -(bStack_61 == bVar29);
    auVar30[8] = -(uStack_60 == uVar25);
    auVar30[9] = -(uStack_5f == uVar27);
    auVar30[10] = -(uStack_5e == uVar28);
    auVar30[0xb] = -(bStack_5d == bVar29);
    auVar30[0xc] = -(uStack_5c == uVar25);
    auVar30[0xd] = -(uStack_5b == uVar27);
    auVar30[0xe] = -(uStack_5a == uVar28);
    auVar30[0xf] = -(bStack_59 == bVar29);
    uVar14 = (ushort)(SUB161(auVar30 >> 7,0) & 1) | (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe;
    if (uVar14 != 0) {
      uVar17 = (uint)uVar14;
      ppVar8 = (pCVar6->instanceSideEffectMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
               .arrays.elements_;
      do {
        iVar11 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> iVar11 & 1) == 0; iVar11 = iVar11 + 1) {
          }
        }
        if (pIVar7 == *(InstanceSymbol **)
                       ((long)&ppVar8[uVar20 * 0xf].first + (ulong)(uint)(iVar11 << 4))) {
          ppVar19 = *(pointer *)
                     ((long)&ppVar8[uVar20 * 0xf].second._M_t.
                             super___uniq_ptr_impl<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
                             .
                             super__Head_base<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_false>
                     + (ulong)(uint)(iVar11 << 4));
          goto LAB_0027480a;
        }
        uVar17 = uVar17 - 1 & uVar17;
      } while (uVar17 != 0);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar21 & 7] & bStack_59) == 0) break;
  }
LAB_0027480a:
  *(undefined1 *)
   &other[1].ifaceKeys.
    super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = 1;
  other[1].ifaceKeys.
  super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = ppVar19;
LAB_00274813:
  ppIVar18 = std::optional<const_slang::ast::Compilation::InstanceSideEffects_*>::value
                       ((optional<const_slang::ast::Compilation::InstanceSideEffects_*> *)
                        &other[1].ifaceKeys);
  pIVar9 = *ppIVar18;
  if ((pIVar9 == (InstanceSideEffects *)0x0) ||
     ((pIVar9->cannotCache == false &&
      ((pIVar9->upwardNames).
       super__Vector_base<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (pIVar9->upwardNames).
       super__Vector_base<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
       ._M_impl.super__Vector_impl_data._M_finish)))) {
    symbol->canonicalBody = (InstanceBodySymbol *)other[1].symbol.ptr;
    uVar17 = (this->compilation->options).flags.m_bits & 0x4000;
    bVar15 = uVar17 == 0;
    if ((char)(uVar17 >> 0xe) == '\0' && pIVar9 != (InstanceSideEffects *)0x0) {
      pIVar10 = (pIVar9->ifacePortDrivers).
                super__Vector_base<slang::ast::Compilation::InstanceSideEffects::IfacePortDriver,_std::allocator<slang::ast::Compilation::InstanceSideEffects::IfacePortDriver>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ifacePortDriver_00 =
                (pIVar9->ifacePortDrivers).
                super__Vector_base<slang::ast::Compilation::InstanceSideEffects::IfacePortDriver,_std::allocator<slang::ast::Compilation::InstanceSideEffects::IfacePortDriver>_>
                ._M_impl.super__Vector_impl_data._M_start; ifacePortDriver_00 != pIVar10;
          ifacePortDriver_00 = ifacePortDriver_00 + 1) {
        applyInstanceSideEffect(this,ifacePortDriver_00,symbol);
      }
      bVar15 = true;
    }
    goto LAB_00274832;
  }
LAB_00274830:
  bVar15 = false;
LAB_00274832:
  std::
  vector<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
  ::~vector(&local_a0.ifaceKeys);
  return bVar15;
}

Assistant:

bool tryApplyFromCache(const InstanceSymbol& symbol) {
        if (disableCache)
            return false;

        // We can use a cached version of this instance's body if we have already
        // visited an identical body elsewhere, with some caveats explained below.
        SLANG_ASSERT(symbol.getCanonicalBody() == nullptr);

        // Instances that are targeted by defparams, bind directives, or configuration rules,
        // or that are themselves created by a bind directive, cannot participate in caching.
        if (!isEligibleForCaching(symbol))
            return false;

        // "Identical" needs to take into account parameter values and interface ports,
        // since the types of members and expression can vary based on those. This is
        // computed in the InstanceCacheKey.
        //
        // Interface ports must be connected to instances that themselves follow the
        // restrictions on defparams, bind directives, and config rules. This is checked
        // in the InstanceCacheKey constructor and returned in the 'valid' parameter.
        bool valid = true;
        InstanceCacheKey key(symbol, valid);
        if (!valid)
            return false;

        auto [it, inserted] = instanceCache.try_emplace(std::move(key), symbol.body);
        if (inserted)
            return false;

        // If we haven't resolved the side effects entry yet do that now.
        // We do this opportunistically here because we know we have a cache hit.
        auto& entry = it->second;
        if (!entry.sideEffects) {
            if (auto sideEffectIt = compilation.instanceSideEffectMap.find(entry.canonicalBody);
                sideEffectIt != compilation.instanceSideEffectMap.end()) {
                entry.sideEffects = sideEffectIt->second.get();
            }
            else {
                entry.sideEffects = nullptr;
            }
        }

        // If any hierarchical names extend upward out of the instance we won't consider
        // it for caching, since the names could be different based on the context.
        // This could be optimized in the future by having another layer of caching based
        // on what the name resolves to for each instance.
        auto sideEffects = entry.sideEffects.value();
        if (sideEffects && (sideEffects->cannotCache || !sideEffects->upwardNames.empty())) {
            return false;
        }

        // Assuming we find an appropriately cached instance, we will store a pointer to it
        // in other instances to facilitate downstream consumers in not needing to recreate
        // this duplication detection logic again.
        symbol.setCanonicalBody(*entry.canonicalBody);
        if (compilation.hasFlag(CompilationFlags::DisableInstanceCaching))
            return false;

        // Apply any side effects that come from the cached instance
        // in the context of the current instance.
        if (sideEffects) {
            for (auto& ifacePortDriver : sideEffects->ifacePortDrivers)
                applyInstanceSideEffect(ifacePortDriver, symbol);
        }

        return true;
    }